

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O3

int priv_rsa_finish(RSA *rsa)

{
  size_t sVar1;
  int iVar2;
  int *piVar3;
  char *fmt;
  expbuf_t buf;
  st_neverbleed_thread_data_t *thdata;
  st_neverbleed_rsa_exdata_t *exdata;
  expbuf_t local_48;
  st_neverbleed_thread_data_t *local_28;
  st_neverbleed_rsa_exdata_t *local_20;
  
  get_privsep_data(rsa,&local_20,&local_28);
  local_48.end = (char *)0x0;
  local_48.capacity = 0;
  local_48.buf = (char *)0x0;
  local_48.start = (char *)0x0;
  expbuf_reserve(&local_48,0xc);
  builtin_strncpy(local_48.end,"del_rsa_key",0xc);
  local_48.end = local_48.end + 0xc;
  sVar1 = local_20->key_index;
  expbuf_reserve(&local_48,8);
  *(size_t *)local_48.end = sVar1;
  local_48.end = (char *)((long)local_48.end + 8);
  iVar2 = expbuf_write((expbuf_t *)local_48.start,(int)local_48.end);
  if (iVar2 == 0) {
    expbuf_dispose(&local_48);
    iVar2 = expbuf_read(&local_48,local_28->fd);
    if (iVar2 == 0) {
      if (7 < (ulong)((long)local_48.end - (long)local_48.start)) {
        iVar2 = *(int *)(char **)local_48.start;
        local_48.start = (char *)((long)local_48.start + 8);
        expbuf_dispose(&local_48);
        return iVar2;
      }
      piVar3 = __errno_location();
      *piVar3 = 0;
      fmt = "failed to parse response";
      goto LAB_0018924e;
    }
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    fmt = "read error";
  }
  else {
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    fmt = "write error";
  }
  if (iVar2 == 0) {
    fmt = "connection closed by daemon";
  }
LAB_0018924e:
  dief(fmt);
}

Assistant:

static int priv_rsa_finish(RSA *rsa)
{
    struct st_neverbleed_rsa_exdata_t *exdata;
    struct st_neverbleed_thread_data_t *thdata;

    get_privsep_data(rsa, &exdata, &thdata);

    struct expbuf_t buf = {NULL};
    size_t ret;

    expbuf_push_str(&buf, "del_rsa_key");
    expbuf_push_num(&buf, exdata->key_index);
    if (expbuf_write(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "write error" : "connection closed by daemon");
    expbuf_dispose(&buf);

    if (expbuf_read(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "read error" : "connection closed by daemon");
    if (expbuf_shift_num(&buf, &ret) != 0) {
        errno = 0;
        dief("failed to parse response");
    }
    expbuf_dispose(&buf);

    return (int)ret;
}